

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

QSize __thiscall QToolBarAreaLayoutInfo::minimumSize(QToolBarAreaLayoutInfo *this)

{
  bool bVar1;
  QSize QVar2;
  uint uVar3;
  Representation RVar4;
  long lVar5;
  ulong uVar6;
  QToolBarAreaLayoutLine *this_00;
  uint uVar7;
  
  if ((this->lines).d.size == 0) {
    uVar7 = 0;
    uVar3 = 0;
  }
  else {
    lVar5 = 0;
    uVar6 = 0;
    uVar3 = 0;
    uVar7 = 0;
    do {
      this_00 = (QToolBarAreaLayoutLine *)((long)&(((this->lines).d.ptr)->rect).x1.m_i + lVar5);
      bVar1 = QToolBarAreaLayoutLine::skip(this_00);
      if (!bVar1) {
        QVar2 = QToolBarAreaLayoutLine::minimumSize(this_00);
        RVar4.m_i = QVar2.ht.m_i.m_i;
        if (this->o == Horizontal) {
          RVar4.m_i = QVar2.wd.m_i.m_i;
        }
        if ((int)uVar7 <= RVar4.m_i) {
          uVar7 = RVar4.m_i;
        }
        RVar4.m_i = QVar2.ht.m_i.m_i;
        if (this->o == Vertical) {
          RVar4.m_i = QVar2.wd.m_i.m_i;
        }
        uVar3 = RVar4.m_i + uVar3;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x30;
    } while (uVar6 < (ulong)(this->lines).d.size);
  }
  if (this->o == Horizontal) {
    uVar6 = (ulong)uVar3;
  }
  else if (this->o == Vertical) {
    uVar6 = (ulong)uVar7;
    uVar7 = uVar3;
  }
  else {
    uVar6 = (ulong)uVar3;
    uVar7 = 0xffffffff;
  }
  return (QSize)((ulong)uVar7 | uVar6 << 0x20);
}

Assistant:

QSize QToolBarAreaLayoutInfo::minimumSize() const
{
    int a = 0, b = 0;
    for (int i = 0; i < lines.size(); ++i) {
        const QToolBarAreaLayoutLine &l = lines.at(i);
        if (l.skip())
            continue;

        QSize m = l.minimumSize();
        a = qMax(a, pick(o, m));
        b += perp(o, m);
    }

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

    return result;
}